

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_voice.c
# Opt level: O2

ALLEGRO_VOICE * al_create_voice(uint freq,ALLEGRO_AUDIO_DEPTH depth,ALLEGRO_CHANNEL_CONF chan_conf)

{
  ALLEGRO_AUDIO_DRIVER *pAVar1;
  int iVar2;
  ALLEGRO_VOICE *object;
  ALLEGRO_MUTEX *pAVar3;
  ALLEGRO_COND *pAVar4;
  _AL_LIST_ITEM *p_Var5;
  
  if (freq == 0) {
    _al_set_error(1,"Invalid Voice Frequency");
  }
  else {
    object = (ALLEGRO_VOICE *)
             al_calloc_with_context
                       (1,0x58,0x4b,
                        "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/kcm_voice.c"
                        ,"al_create_voice");
    if (object != (ALLEGRO_VOICE *)0x0) {
      object->depth = depth;
      object->chan_conf = chan_conf;
      object->frequency = freq;
      pAVar3 = (ALLEGRO_MUTEX *)al_create_mutex();
      object->mutex = pAVar3;
      pAVar4 = (ALLEGRO_COND *)al_create_cond();
      object->cond = pAVar4;
      pAVar1 = _al_kcm_driver;
      object->driver = _al_kcm_driver;
      iVar2 = (*pAVar1->allocate_voice)(object);
      if (iVar2 == 0) {
        p_Var5 = _al_kcm_register_destructor("voice",object,al_destroy_voice);
        object->dtor_item = p_Var5;
        return object;
      }
      al_destroy_mutex(object->mutex);
      al_destroy_cond(object->cond);
      al_free_with_context
                (object,0x5d,
                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/kcm_voice.c"
                 ,"al_create_voice");
    }
  }
  return (ALLEGRO_VOICE *)0x0;
}

Assistant:

ALLEGRO_VOICE *al_create_voice(unsigned int freq,
   ALLEGRO_AUDIO_DEPTH depth, ALLEGRO_CHANNEL_CONF chan_conf)
{
   ALLEGRO_VOICE *voice = NULL;

   if (!freq) {
      _al_set_error(ALLEGRO_INVALID_PARAM, "Invalid Voice Frequency");
      return NULL;
   }

   voice = al_calloc(1, sizeof(*voice));
   if (!voice) {
      return NULL;
   }

   voice->depth     = depth;
   voice->chan_conf = chan_conf;
   voice->frequency = freq;

   voice->mutex = al_create_mutex();
   voice->cond = al_create_cond();
   /* XXX why is this needed? there should only be one active driver */
   voice->driver = _al_kcm_driver;

   ASSERT(_al_kcm_driver);
   if (_al_kcm_driver->allocate_voice(voice) != 0) {
      al_destroy_mutex(voice->mutex);
      al_destroy_cond(voice->cond);
      al_free(voice);
      return NULL;
   }

   voice->dtor_item = _al_kcm_register_destructor("voice", voice,
      (void (*)(void *)) al_destroy_voice);

   return voice;
}